

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O2

char * uplevel(void)

{
  size_t sVar1;
  size_t sVar2;
  char *__s;
  long lVar3;
  
  __s = pathname;
  if (pathname == (char *)0x0) {
    __s = (char *)0x0;
  }
  else {
    sVar1 = strlen(pathname);
    lVar3 = (long)(int)sVar1;
    do {
      lVar3 = lVar3 + -1;
      if (__s + lVar3 <= __s) goto LAB_001046a5;
    } while (__s[lVar3] != '/');
    __s[lVar3] = '\0';
LAB_001046a5:
    if (lVar3 == 0) {
      free(__s);
      __s = (char *)0x0;
      pathname = __s;
    }
    else {
      sVar2 = strlen(__s);
      if ((int)sVar2 < (int)sVar1) {
        __s = (char *)realloc(__s,(long)((int)sVar2 + 1));
        pathname = __s;
      }
    }
  }
  return __s;
}

Assistant:

char *
uplevel()
{
	register char *cptr;
	register int olen, nlen;

	if (!pathname)
		return (NULL);

	olen = strlen(pathname);
	cptr = pathname + olen - 1;
	while (cptr > pathname)
		if (*cptr == PATHSEP)
		{
			*cptr = '\0';
			break;
		}
		else
			cptr--;

	if (cptr == pathname)
	{
		free(pathname);
		pathname = NULL;
	}
	else
	{
		nlen = strlen(pathname);
		if (nlen < olen)
			pathname = realloc(pathname, nlen + 1);
	}
	return (pathname);
}